

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O1

bool __thiscall Varnode::copyShadow(Varnode *this,Varnode *op2)

{
  while( true ) {
    if (this == op2) {
      return true;
    }
    if (((this->flags & 0x10) == 0) || (this->def->opcode->opcode != CPUI_COPY)) break;
    this = *(this->def->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  }
  while (((op2->flags & 0x10) != 0 && (op2->def->opcode->opcode == CPUI_COPY))) {
    op2 = *(op2->def->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    if (this == op2) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Varnode::copyShadow(const Varnode *op2) const

{
  const Varnode *vn;

  if (this==op2) return true;
				// Trace -this- to the source of the copy chain
  vn = this;
  while( (vn->isWritten()) && (vn->getDef()->code() == CPUI_COPY)) {
    vn = vn->getDef()->getIn(0);
    if (vn == op2) return true;	// If we hit op2 then this and op2 must be the same
  }
				// Trace op2 to the source of copy chain
  while( (op2->isWritten()) && (op2->getDef()->code() == CPUI_COPY)) {
    op2 = op2->getDef()->getIn(0);
    if (vn == op2) return true;	// If the source is the same then this and op2 are same
  }
  return false;
}